

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execClr<(moira::Instr)36,(moira::Mode)6,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 ea;
  u32 data;
  u32 local_10;
  u32 local_c;
  
  bVar1 = readOp<(moira::Mode)6,(moira::Size)2,128ul>(this,opcode & 7,&local_10,&local_c);
  if (bVar1) {
    prefetch<0ul>(this);
    writeM<(moira::MemSpace)1,(moira::Size)2,5ul>(this,local_10,0);
    (this->reg).sr.n = false;
    (this->reg).sr.z = true;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
  }
  return;
}

Assistant:

void
Moira::execClr(u16 opcode)
{
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    isMemMode(M) ? prefetch() : prefetch<POLLIPL>();

    if (S == Long && isRegMode(M)) sync(2);
    writeOp <M,S, REVERSE | POLLIPL> (dst, ea, 0);

    reg.sr.n = 0;
    reg.sr.z = 1;
    reg.sr.v = 0;
    reg.sr.c = 0;
}